

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

void __thiscall raft_functional_common::TestMgr::TestMgr(TestMgr *this,int srv_id,string *endpoint)

{
  element_type *this_00;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *this_01;
  string *in_RDX;
  undefined4 in_ESI;
  state_mgr *in_RDI;
  shared_ptr<nuraft::cluster_config> *__r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  bool *in_stack_ffffffffffffff18;
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  state_mgr *args_1;
  state_mgr *args;
  state_mgr *args_5;
  shared_ptr<nuraft::cluster_config> local_98;
  undefined1 local_88 [40];
  string local_60 [36];
  undefined4 local_3c;
  string *local_18;
  undefined4 local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  nuraft::state_mgr::state_mgr(in_RDI);
  in_RDI->_vptr_state_mgr = (_func_int **)&PTR__TestMgr_006e4758;
  *(undefined4 *)&in_RDI[1]._vptr_state_mgr = local_c;
  std::__cxx11::string::string((string *)(in_RDI + 2),local_18);
  args_5 = in_RDI + 6;
  nuraft::cs_new<nuraft::inmem_log_store>();
  args_1 = in_RDI + 8;
  std::shared_ptr<nuraft::srv_config>::shared_ptr((shared_ptr<nuraft::srv_config> *)0x19058d);
  args = in_RDI + 10;
  std::shared_ptr<nuraft::cluster_config>::shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x1905a0);
  std::shared_ptr<nuraft::srv_state>::shared_ptr((shared_ptr<nuraft::srv_state> *)0x1905b3);
  local_3c = 1;
  std::__cxx11::to_string((int)((ulong)in_RDI >> 0x20));
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_88[7] = 0;
  local_88._0_4_ = 0x32;
  __r = (shared_ptr<nuraft::cluster_config> *)local_88;
  nuraft::
  cs_new<nuraft::srv_config,int&,int,std::__cxx11::string_const&,std::__cxx11::string,bool,int>
            ((int *)args,(int *)args_1,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,(int *)args_5);
  std::shared_ptr<nuraft::srv_config>::operator=
            ((shared_ptr<nuraft::srv_config> *)in_stack_ffffffffffffff10,
             (shared_ptr<nuraft::srv_config> *)__r);
  std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x190667);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  nuraft::cs_new<nuraft::cluster_config>();
  __x = (value_type *)(in_RDI + 10);
  std::shared_ptr<nuraft::cluster_config>::operator=(&local_98,__r);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x1906b1);
  this_00 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1906bb);
  this_01 = nuraft::cluster_config::get_servers_abi_cxx11_(this_00);
  std::__cxx11::
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>::
  push_back(this_01,__x);
  return;
}

Assistant:

TestMgr(int srv_id,
            const std::string& endpoint)
        : myId(srv_id)
        , myEndpoint(endpoint)
        , curLogStore( cs_new<inmem_log_store>() )
    {
        mySrvConfig = cs_new<srv_config>
                      ( srv_id,
                        1,
                        endpoint,
                        "server " + std::to_string(srv_id),
                        false,
                        50 );

        savedConfig = cs_new<cluster_config>();
        savedConfig->get_servers().push_back(mySrvConfig);
    }